

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ostream * operator<<(ostream *out,ShapeConstraint *shape)

{
  ShapeConstraint *pSVar1;
  ostream *poVar2;
  ShapeRange *pSVar3;
  allocator local_69;
  string local_68 [48];
  string local_38;
  ShapeConstraint *shape_local;
  ostream *out_local;
  
  local_38._M_storage._M_storage = (uchar  [8])shape;
  shape_local = (ShapeConstraint *)out;
  CoreML::ShapeConstraint::name_abi_cxx11_(&local_38,shape);
  poVar2 = std::operator<<(out,(string *)&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,":",&local_69);
  poVar2 = std::operator<<(poVar2,local_68);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_38);
  pSVar1 = shape_local;
  pSVar3 = CoreML::ShapeConstraint::sequenceRange((ShapeConstraint *)local_38._M_storage._M_storage)
  ;
  poVar2 = operator<<((ostream *)pSVar1,pSVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pSVar1 = shape_local;
  pSVar3 = CoreML::ShapeConstraint::batchRange((ShapeConstraint *)local_38._M_storage._M_storage);
  poVar2 = operator<<((ostream *)pSVar1,pSVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pSVar1 = shape_local;
  pSVar3 = CoreML::ShapeConstraint::channelRange((ShapeConstraint *)local_38._M_storage._M_storage);
  poVar2 = operator<<((ostream *)pSVar1,pSVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pSVar1 = shape_local;
  pSVar3 = CoreML::ShapeConstraint::heightRange((ShapeConstraint *)local_38._M_storage._M_storage);
  poVar2 = operator<<((ostream *)pSVar1,pSVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pSVar1 = shape_local;
  pSVar3 = CoreML::ShapeConstraint::widthRange((ShapeConstraint *)local_38._M_storage._M_storage);
  poVar2 = operator<<((ostream *)pSVar1,pSVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return (ostream *)shape_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ShapeConstraint& shape) {
    out << shape.name() << std::string(":") << std::endl;
    out << shape.sequenceRange() << std::endl;
    out << shape.batchRange() << std::endl;
    out << shape.channelRange() << std::endl;
    out << shape.heightRange() << std::endl;
    out << shape.widthRange() << std::endl;
    return out;
}